

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O1

void __thiscall
CppGenerator::registerAggregatesToVariables
          (CppGenerator *this,Aggregate *aggregate,size_t group_id,size_t view_id,size_t agg_id,
          size_t depth,
          vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *localAggReg)

{
  ulong *puVar1;
  ulong *puVar2;
  vector<PostAggRegTuple,std::allocator<PostAggRegTuple>> *this_00;
  long lVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar7;
  pointer pbVar8;
  pointer pbVar9;
  size_t *psVar10;
  pointer pbVar11;
  pointer pDVar12;
  pointer ppVar13;
  pointer pvVar14;
  pointer pPVar15;
  undefined8 uVar16;
  pointer pvVar17;
  pointer pPVar18;
  iterator __position;
  pointer pDVar19;
  pointer pDVar20;
  uint uVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  View *pVVar26;
  pointer pbVar27;
  size_t sVar28;
  pointer pbVar29;
  Function *pFVar30;
  size_t sVar31;
  pointer *pppVar32;
  iterator iVar33;
  mapped_type *pmVar34;
  long lVar35;
  unsigned_long uVar36;
  iterator iVar37;
  mapped_type *pmVar38;
  ostream *poVar39;
  ulong uVar40;
  long lVar41;
  unsigned_long *puVar42;
  pair<unsigned_long,_unsigned_long> *__args;
  size_t var;
  ulong uVar43;
  iterator __position_00;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *this_01;
  size_t *incViewID;
  size_t *psVar44;
  bitset<1500UL> *this_02;
  size_t f2;
  size_type __n;
  ulong uVar45;
  long lVar46;
  long lVar47;
  mapped_type mVar48;
  bool bVar49;
  ulong uVar50;
  mapped_type mVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  localComputation;
  dyn_bitset loopFactors;
  prod_bitset overlapFunc;
  prod_bitset localFunctions;
  prod_bitset considered;
  undefined1 local_6e8 [16];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_6a8;
  undefined1 local_688 [16];
  long local_678;
  long local_670;
  TDNode *local_668;
  long local_660;
  Function *local_658;
  unsigned_long local_650;
  long local_648;
  View *local_640;
  long local_638;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_630;
  size_t local_618;
  long local_610;
  long local_608;
  long local_600;
  undefined1 local_5f8 [16];
  ulong local_5e8;
  ulong uStack_5e0;
  ulong local_5d8;
  ulong uStack_5d0;
  undefined1 local_5c8 [192];
  undefined1 local_508 [24];
  unsigned_long uStack_4f0;
  unsigned_long local_4e8;
  undefined1 uStack_4e0;
  undefined7 uStack_4df;
  unsigned_long uStack_4d8;
  bool bStack_4d0;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_4b0;
  bool local_498;
  undefined1 local_490 [192];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_3d0;
  unsigned_long local_3b8;
  unsigned_long uStack_3b0;
  unsigned_long local_3a8;
  unsigned_long uStack_3a0;
  bool local_398;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_390;
  allocator_type local_370 [8];
  ulong auStack_368 [23];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_2b0;
  unsigned_long local_298;
  unsigned_long uStack_290;
  unsigned_long local_288;
  unsigned_long uStack_280;
  undefined1 local_278;
  ulong local_270 [48];
  undefined1 local_f0 [192];
  
  local_650 = agg_id;
  pVVar26 = QueryCompiler::getView
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,view_id);
  local_668 = TreeDecomposition::getRelation
                        ((this->_td).
                         super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (ulong)pVVar26->_origin);
  pbVar27 = (this->groupVariableOrderBitset).
            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>._M_impl.
            super__Vector_impl_data._M_start + group_id;
  pvVar7 = this->groupVariableOrder;
  pbVar8 = (aggregate->_agg).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pbVar9 = (aggregate->_agg).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = ((long)pbVar9 - (long)pbVar8 >> 6) * -0x5555555555555555;
  uVar6 = pVVar26->_origin;
  uVar5 = pVVar26->_destination;
  sVar31 = local_668->_numOfNeighbors;
  local_640 = pVVar26;
  local_618 = group_id;
  sVar28 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&local_390,sVar28 + 1,0,(allocator<unsigned_long> *)local_5c8);
  local_5c8._8_8_ = 0;
  local_5c8._0_8_ =
       (long)pvVar7[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)pvVar7[group_id].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::vector(&local_630,__n,(value_type *)local_5c8,local_370);
  pvVar7 = pvVar7 + group_id;
  local_608 = sVar31 - (uVar6 != uVar5);
  local_688 = ZEXT816(0);
  local_6a8.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a8.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_long,_unsigned_long> *)0x0;
  uVar43 = 0;
  memset(local_270,0,0xc0);
  memset(local_270 + 0x18,0,0xc0);
  auVar52._8_4_ = 0xffffffff;
  auVar52._0_8_ = 0xffffffffffffffff;
  auVar52._12_4_ = 0xffffffff;
  auVar52 = *(undefined1 (*) [16])(pbVar27->super__Base_bitset<2UL>)._M_w ^ auVar52;
  auVar56._0_8_ = auVar52._0_8_;
  auVar56._8_8_ = auVar52._8_8_ & 0xfffffffff;
  local_5f8 = *(undefined1 (*) [16])(local_640->_fVars).super__Base_bitset<2UL>._M_w & auVar56;
  local_670 = view_id * 3;
  do {
    uVar45 = uVar43 >> 6;
    uVar50 = 1L << ((byte)uVar43 & 0x3f);
    if ((*(ulong *)(local_5f8 + uVar45 * 8) >> (uVar43 & 0x3f) & 1) != 0) {
      if (((local_668->_bag).super__Base_bitset<2UL>._M_w[uVar45] & uVar50) == 0) {
        psVar10 = (&(this->incomingViews->
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                    super__Vector_impl_data._M_finish)[local_670];
        for (psVar44 = (&(this->incomingViews->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start)[local_670]; psVar44 != psVar10;
            psVar44 = psVar44 + 1) {
          pVVar26 = QueryCompiler::getView
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               *psVar44);
          if (((pVVar26->_fVars).super__Base_bitset<2UL>._M_w[uVar45] & uVar50) != 0) {
            auVar54._0_8_ = (pbVar27->super__Base_bitset<2UL>)._M_w[0] ^ 0xffffffffffffffff;
            auVar54._8_8_ =
                 ((pbVar27->super__Base_bitset<2UL>)._M_w[1] ^ 0xffffffffffffffff) & 0xfffffffff;
            local_688 = local_688 |
                        *(undefined1 (*) [16])(pVVar26->_fVars).super__Base_bitset<2UL>._M_w &
                        auVar54;
          }
        }
      }
      else {
        auVar53._0_8_ = (pbVar27->super__Base_bitset<2UL>)._M_w[0] ^ 0xffffffffffffffff;
        auVar53._8_8_ =
             ((pbVar27->super__Base_bitset<2UL>)._M_w[1] ^ 0xffffffffffffffff) & 0xfffffffff;
        local_688 = local_688 |
                    *(undefined1 (*) [16])(local_668->_bag).super__Base_bitset<2UL>._M_w & auVar53;
      }
    }
    uVar43 = uVar43 + 1;
  } while (uVar43 != 100);
  if (pbVar9 != pbVar8) {
    local_678 = depth + 1;
    local_610 = __n + (__n == 0);
    local_638 = depth << 4;
    local_5d8 = local_5f8._0_8_;
    uStack_5d0 = local_5f8._8_8_;
    local_5e8 = local_5f8._0_8_ & local_688._0_8_;
    uStack_5e0 = local_5f8._8_8_ & local_688._8_8_;
    lVar47 = 0;
    local_648 = 0;
    local_660 = 0;
    lVar35 = 0;
    do {
      pbVar11 = (aggregate->_agg).
                super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      this_02 = pbVar11 + lVar35;
      memset(local_270 + 0x18,0,0xc0);
      memset(local_270,0,0xc0);
      local_600 = (long)(pbVar11->super__Base_bitset<24UL>)._M_w + lVar47;
      uVar43 = 0;
      do {
        bVar25 = std::bitset<1500UL>::test(this_02,uVar43);
        if ((bVar25) &&
           (uVar45 = uVar43 >> 6, (local_270[uVar45 + 0x18] >> (uVar43 & 0x3f) & 1) == 0)) {
          local_658 = QueryCompiler::getFunction
                                ((this->_qc).
                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,uVar43);
          uVar50 = 1L << ((byte)uVar43 & 0x3f);
          local_270[uVar45 + 0x18] = local_270[uVar45 + 0x18] | uVar50;
          auVar52 = *(undefined1 (*) [16])
                     ((long)(((this->coveredVariables).
                              super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->super__Base_bitset<2UL>).
                            _M_w + local_638) &
                    *(undefined1 (*) [16])(local_658->_fVars).super__Base_bitset<2UL>._M_w;
          if (auVar52._0_8_ == (local_658->_fVars).super__Base_bitset<2UL>._M_w[0]) {
            bVar25 = false;
            do {
              bVar23 = bVar25;
              if (bVar23) goto LAB_00241ab8;
              bVar25 = true;
            } while (auVar52._8_8_ == (local_658->_fVars).super__Base_bitset<2UL>._M_w[1]);
            if (bVar23) {
LAB_00241ab8:
              pbVar29 = (this->variableDependency).
                        super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_6e8 = (undefined1  [16])0x0;
              uVar40 = 0;
              do {
                if (((local_658->_fVars).super__Base_bitset<2UL>._M_w[uVar40 >> 6] >>
                     (uVar40 & 0x3f) & 1) != 0) {
                  local_6e8 = local_6e8 |
                              *(undefined1 (*) [16])(pbVar29->super__Base_bitset<2UL>)._M_w;
                }
                uVar40 = uVar40 + 1;
                pbVar29 = pbVar29 + 1;
              } while (uVar40 != 100);
              auVar55._0_8_ = (pbVar27->super__Base_bitset<2UL>)._M_w[0] ^ 0xffffffffffffffff;
              auVar55._8_8_ =
                   ((pbVar27->super__Base_bitset<2UL>)._M_w[1] ^ 0xffffffffffffffff) & 0xfffffffff;
              memset(local_5c8,0,0xc0);
              *(ulong *)(local_5c8 + uVar45 * 8) = *(ulong *)(local_5c8 + uVar45 * 8) | uVar50;
              memcpy(local_370,local_5c8,0xc0);
              auVar52 = (undefined1  [16])0x0;
              do {
                auVar52 = auVar52 | *(undefined1 (*) [16])
                                     (local_658->_fVars).super__Base_bitset<2UL>._M_w;
                bVar23 = true;
                bVar25 = true;
                uVar45 = 0;
                bVar49 = false;
                do {
                  uVar50 = uVar45 >> 6;
                  uVar40 = 1L << ((byte)uVar45 & 0x3f);
                  if (((((this_02->super__Base_bitset<24UL>)._M_w[uVar50] >> (uVar45 & 0x3f) & 1) !=
                        0) && ((local_270[uVar50 + 0x18] & uVar40) == 0)) &&
                     ((auStack_368[uVar50 - 1] & uVar40) == 0)) {
                    pFVar30 = QueryCompiler::getFunction
                                        ((this->_qc).
                                         super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,uVar43);
                    auVar56 = *(undefined1 (*) [16])(pFVar30->_fVars).super__Base_bitset<2UL>._M_w &
                              local_6e8 & auVar55;
                    if (auVar56._0_8_ == 0) {
                      bVar24 = true;
                      do {
                        bVar22 = bVar24;
                        if (!bVar22) break;
                        bVar24 = false;
                      } while (auVar56._8_8_ == 0);
                      if (!bVar22) goto LAB_00241bd5;
                    }
                    local_270[uVar50 + 0x18] = local_270[uVar50 + 0x18] | uVar40;
                    auStack_368[uVar50 - 1] = auStack_368[uVar50 - 1] | uVar40;
                    auVar56 = *(undefined1 (*) [16])(pFVar30->_fVars).super__Base_bitset<2UL>._M_w;
                    auVar52 = auVar52 | auVar56;
                    auVar56 = *(undefined1 (*) [16])
                               ((long)(((this->coveredVariables).
                                        super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Base_bitset<2UL>)._M_w + local_638) & auVar56;
                    bVar49 = true;
                    if (auVar56._0_8_ == (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[0]) {
                      bVar25 = bVar23;
                      if (auVar56._8_8_ != (pFVar30->_fVars).super__Base_bitset<2UL>._M_w[1]) {
                        bVar25 = false;
                        bVar23 = bVar25;
                      }
                    }
                    else {
                      bVar25 = false;
                      bVar23 = false;
                    }
                  }
LAB_00241bd5:
                  lVar46 = local_600;
                  uVar45 = uVar45 + 1;
                } while (uVar45 != 0x5dc);
              } while ((bVar49) && (!bVar25));
              if (bVar25) {
                auVar59._0_8_ = (pbVar27->super__Base_bitset<2UL>)._M_w[0] ^ 0xffffffffffffffff;
                auVar59._8_8_ =
                     ((pbVar27->super__Base_bitset<2UL>)._M_w[1] ^ 0xffffffffffffffff) & 0xfffffffff
                ;
                auVar59 = auVar52 & local_688 & auVar59;
                if (auVar59._0_8_ == 0) {
                  bVar25 = true;
                  do {
                    bVar23 = bVar25;
                    if (!bVar23) break;
                    bVar25 = false;
                  } while (auVar59._8_8_ == 0);
                  if (bVar23) goto LAB_00241d3c;
                  lVar41 = 0;
                  do {
                    local_270[lVar41] = local_270[lVar41] | auStack_368[lVar41 + -1];
                    local_270[lVar41 + 1] = local_270[lVar41 + 1] | auStack_368[lVar41];
                    lVar41 = lVar41 + 2;
                  } while (lVar41 != 0x18);
                }
                else {
LAB_00241d3c:
                  if (this->viewLevelRegister[view_id] != depth) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"ERROR ERROR: in dependent computation:",0x26);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr," viewLevelRegister[viewID] != depth\n",0x24);
                  }
                  pDVar12 = (this->dependentComputation).
                            super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  lVar41 = 0;
                  do {
                    uVar45 = auStack_368[lVar41];
                    puVar1 = (ulong *)((long)(pDVar12->product).super__Base_bitset<24UL>._M_w +
                                      lVar41 * 8 + local_648);
                    uVar50 = puVar1[1];
                    puVar2 = (ulong *)((long)(pDVar12->product).super__Base_bitset<24UL>._M_w +
                                      lVar41 * 8 + local_648);
                    *puVar2 = *puVar1 | auStack_368[lVar41 + -1];
                    puVar2[1] = uVar50 | uVar45;
                    lVar41 = lVar41 + 2;
                  } while (lVar41 != 0x18);
                }
                memcpy(local_5c8,local_370,0xc0);
                lVar41 = 0;
                do {
                  lVar3 = lVar41 * 8;
                  uVar5 = *(uint *)(local_5c8 + lVar3 + 4);
                  uVar6 = *(uint *)(local_5c8 + lVar3 + 8);
                  uVar21 = *(uint *)(local_5c8 + lVar3 + 0xc);
                  lVar4 = lVar41 * 8;
                  *(uint *)(local_5c8 + lVar4) = *(uint *)(local_5c8 + lVar3) ^ 0xffffffff;
                  *(uint *)(local_5c8 + lVar4 + 4) = uVar5 ^ 0xffffffff;
                  *(uint *)(local_5c8 + lVar4 + 8) = uVar6 ^ 0xffffffff;
                  *(uint *)(local_5c8 + lVar4 + 0xc) = uVar21 ^ 0xffffffff;
                  lVar41 = lVar41 + 2;
                } while (lVar41 != 0x18);
                local_5c8._184_8_ = local_5c8._184_8_ & 0xfffffff;
                memcpy(local_f0,local_5c8,0xc0);
                lVar41 = 0;
                do {
                  *(undefined1 (*) [16])(lVar46 + lVar41 * 8) =
                       *(undefined1 (*) [16])(lVar46 + lVar41 * 8) &
                       *(undefined1 (*) [16])(local_f0 + lVar41 * 8);
                  lVar41 = lVar41 + 2;
                } while (lVar41 != 0x18);
              }
            }
          }
        }
        uVar43 = uVar43 + 1;
      } while (uVar43 != 0x5dc);
      if (local_6a8.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_6a8.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_6a8.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_6a8.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar46 = local_660;
      if (local_608 != 0) {
        lVar41 = local_608 + local_660;
        do {
          ppVar13 = (aggregate->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar36 = ppVar13[lVar46].first;
          sVar31 = QueryCompiler::numberOfViews
                             ((this->_qc).
                              super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          uVar43 = (sVar31 + 1) * depth + uVar36;
          if (((this->addableViews).m_bits.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar43 >> 6] >> (uVar43 & 0x3f) & 1) != 0) {
            pVVar26 = QueryCompiler::getView
                                ((this->_qc).
                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr,ppVar13[lVar46].first);
            auVar58._0_8_ = (pbVar27->super__Base_bitset<2UL>)._M_w[0] ^ 0xffffffffffffffff;
            auVar58._8_8_ =
                 ((pbVar27->super__Base_bitset<2UL>)._M_w[1] ^ 0xffffffffffffffff) & 0xfffffffff;
            auVar52 = *(undefined1 (*) [16])(local_640->_fVars).super__Base_bitset<2UL>._M_w &
                      auVar58 & *(undefined1 (*) [16])(pVVar26->_fVars).super__Base_bitset<2UL>._M_w
            ;
            if (auVar52._0_8_ == 0) {
              bVar25 = true;
              do {
                bVar23 = bVar25;
                if (!bVar23) break;
                bVar25 = false;
              } while (auVar52._8_8_ == 0);
              if (bVar23) goto LAB_00241f95;
              __args = (aggregate->_incoming).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar46;
              if (local_6a8.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_6a8.
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                this_01 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                           *)&local_6a8;
                __position_00._M_current =
                     local_6a8.
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                goto LAB_00241fe1;
              }
              uVar36 = __args->second;
              (local_6a8.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->first = __args->first;
              (local_6a8.
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->second = uVar36;
              pppVar32 = &local_6a8.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
LAB_00241fd0:
              *pppVar32 = *pppVar32 + 1;
            }
            else {
LAB_00241f95:
              pDVar12 = (this->dependentComputation).
                        super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              __args = (aggregate->_incoming).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar46;
              __position_00._M_current =
                   *(pointer *)
                    ((long)&pDVar12[lVar35].view.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl + 8);
              if (__position_00._M_current !=
                  *(pointer *)
                   ((long)&pDVar12[lVar35].view.
                           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                           ._M_impl + 0x10)) {
                pppVar32 = (pointer *)
                           ((long)&pDVar12[lVar35].view.
                                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                   ._M_impl + 8);
                uVar36 = __args->second;
                (__position_00._M_current)->first = __args->first;
                (__position_00._M_current)->second = uVar36;
                goto LAB_00241fd0;
              }
              this_01 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                         *)&pDVar12[lVar35].view;
LAB_00241fe1:
              std::
              vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
              ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>const&>
                        (this_01,__position_00,__args);
            }
            sVar31 = QueryCompiler::numberOfViews
                               ((this->_qc).
                                super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
            (aggregate->_incoming).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar46].first = sVar31;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 != lVar41);
      }
      local_660 = lVar46;
      if (local_270[0] == 0) {
        uVar43 = 0xffffffffffffffff;
        do {
          if (uVar43 == 0x16) {
            uVar45 = 0x17;
            break;
          }
          uVar45 = uVar43 + 1;
          lVar46 = uVar43 + 2;
          uVar43 = uVar45;
        } while (local_270[lVar46] == 0);
        if (uVar45 < 0x17) goto LAB_002420a6;
        if (local_6a8.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_6a8.
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_002420a6;
        lVar46 = (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        if ((local_678 == lVar46) &&
           (auVar57._8_8_ = uStack_5e0, auVar57._0_8_ = local_5e8,
           auVar57 = *(undefined1 (*) [16])(local_668->_bag).super__Base_bitset<2UL>._M_w & auVar57,
           auVar57._0_8_ == 0)) {
          bVar25 = true;
          do {
            bVar23 = bVar25;
            if (!bVar23) break;
            bVar25 = false;
          } while (auVar57._8_8_ == 0);
          if (!bVar23) goto LAB_002420a6;
        }
        if (this->viewLevelRegister[view_id] == depth) {
          local_630.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar35] =
               (localAggReg->
               super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_start[lVar35];
        }
        else if (local_678 == lVar46) {
          std::operator<<((ostream *)&std::cerr,
                          "WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
          goto LAB_002423d5;
        }
      }
      else {
LAB_002420a6:
        uStack_4d8 = 0;
        bStack_4d0 = false;
        local_4e8 = 0;
        uStack_4e0 = 0;
        uStack_4df = 0;
        stack0xfffffffffffffb08 = (undefined1  [16])0x0;
        local_508._0_16_ = (undefined1  [16])0x0;
        memcpy(local_5c8,local_270,0xc0);
        std::
        vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::operator=((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     *)local_508,&local_6a8);
        if ((this->viewLevelRegister[view_id] < depth) ||
           (this->viewLevelRegister[view_id] ==
            (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3)) {
          uStack_4f0 = (long)(pvVar7->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pvVar7->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start >> 3;
          local_4e8 = 0;
        }
        else {
          ppVar13 = (localAggReg->
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + lVar35;
          uStack_4f0 = ppVar13->first;
          local_4e8 = ppVar13->second;
        }
        if (local_678 ==
            (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 3) {
          if (((local_668->_bag).super__Base_bitset<2UL>._M_w[0] & local_5d8 & local_688._0_8_) != 0
             ) goto LAB_002421c6;
          bVar25 = true;
          do {
            bVar23 = bVar25;
            if (!bVar23) break;
            bVar25 = false;
          } while (((local_668->_bag).super__Base_bitset<2UL>._M_w[1] & uStack_5d0 & local_688._8_8_
                   ) == 0);
          if (bVar23) goto LAB_002421c6;
          bStack_4d0 = true;
        }
        else {
LAB_002421c6:
          bStack_4d0 = false;
        }
        iVar33 = std::
                 _Hashtable<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->productToVariableMap).
                         super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[depth]._M_h,(key_type *)local_5c8
                       );
        if (iVar33.super__Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pvVar14 = (this->productToVariableRegister).
                    super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar46 = *(long *)&pvVar14[depth].
                             super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                             ._M_impl.super__Vector_impl_data;
          pPVar15 = *(pointer *)
                     ((long)&pvVar14[depth].
                             super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>
                             ._M_impl.super__Vector_impl_data + 8);
          pmVar34 = std::__detail::
                    _Map_base<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<ProductAggregate,_std::pair<const_ProductAggregate,_unsigned_long>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<ProductAggregate>,_ProductAggregate_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)((this->productToVariableMap).
                                     super__Vector_base<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>,_std::allocator<std::unordered_map<ProductAggregate,_unsigned_long,_ProductAggregate_hash,_std::equal_to<ProductAggregate>,_std::allocator<std::pair<const_ProductAggregate,_unsigned_long>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + depth),
                                 (key_type *)local_5c8);
          mVar51 = (long)pPVar15 - lVar46 >> 8;
          *pmVar34 = mVar51;
          local_630.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar35].first = depth;
          local_630.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar35].second = mVar51;
          std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>::push_back
                    ((this->productToVariableRegister).
                     super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + depth,(value_type *)local_5c8);
        }
        else {
          uVar36 = *(unsigned_long *)
                    ((long)iVar33.
                           super__Node_iterator_base<std::pair<const_ProductAggregate,_unsigned_long>,_true>
                           ._M_cur + 0x108);
          local_630.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar35].first = depth;
          local_630.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar35].second = uVar36;
        }
        (localAggReg->
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        )._M_impl.super__Vector_impl_data._M_start[lVar35] =
             local_630.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar35];
        if ((pointer)local_508._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_508._0_8_);
        }
      }
      lVar35 = lVar35 + 1;
      local_648 = local_648 + 0xd8;
      lVar47 = lVar47 + 0xc0;
    } while (lVar35 != local_610);
  }
  uVar36 = (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  if (uVar36 - 1 == depth) {
    if (pbVar9 != pbVar8) {
      lVar35 = __n + (__n == 0);
      puVar42 = &((localAggReg->
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->second;
      do {
        ((pair<unsigned_long,_unsigned_long> *)(puVar42 + -1))->first = uVar36;
        *puVar42 = 0;
        puVar42 = puVar42 + 2;
        lVar35 = lVar35 + -1;
      } while (lVar35 != 0);
    }
  }
  else {
    registerAggregatesToVariables(this,aggregate,local_618,view_id,local_650,depth + 1,localAggReg);
  }
  if (this->viewLevelRegister[view_id] < depth) {
    if (pbVar9 != pbVar8) {
LAB_002424b0:
      lVar47 = 0;
      lVar35 = 0;
      do {
        uVar43 = (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3;
        if ((*(ulong *)((long)&(local_630.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->first + lVar47) < uVar43
            ) || (*(ulong *)((long)&((localAggReg->
                                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->first + lVar47) <
                  uVar43)) {
          local_5c8._0_16_ =
               *(undefined1 (*) [16])
                ((long)&(local_630.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar47);
          local_5c8._16_16_ =
               *(undefined1 (*) [16])
                ((long)&((localAggReg->
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->first + lVar47);
          iVar37 = std::
                   _Hashtable<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->postRegisterMap).
                           super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[depth]._M_h,
                          (key_type *)local_5c8);
          if (iVar37.
              super__Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true>.
              _M_cur == (__node_type *)0x0) {
            pvVar17 = (this->postRegisterList).
                      super__Vector_base<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar46 = *(long *)&pvVar17[depth].
                               super__Vector_base<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>
                               ._M_impl.super__Vector_impl_data;
            pPVar18 = *(pointer *)
                       ((long)&pvVar17[depth].
                               super__Vector_base<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>
                               ._M_impl.super__Vector_impl_data + 8);
            pmVar38 = std::__detail::
                      _Map_base<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<PostAggRegTuple,_std::pair<const_PostAggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<PostAggRegTuple>,_PostAggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)((this->postRegisterMap).
                                       super__Vector_base<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<PostAggRegTuple,_unsigned_long,_PostAggRegTuple_hash,_std::equal_to<PostAggRegTuple>,_std::allocator<std::pair<const_PostAggRegTuple,_unsigned_long>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + depth),
                                   (key_type *)local_5c8);
            mVar48 = (long)pPVar18 - lVar46 >> 5;
            *pmVar38 = mVar48;
            ppVar13 = (localAggReg->
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(size_t *)((long)&ppVar13->first + lVar47) = depth;
            *(mapped_type *)((long)&ppVar13->second + lVar47) = mVar48;
            this_00 = (vector<PostAggRegTuple,std::allocator<PostAggRegTuple>> *)
                      ((this->postRegisterList).
                       super__Vector_base<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>,_std::allocator<std::vector<PostAggRegTuple,_std::allocator<PostAggRegTuple>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + depth);
            __position._M_current = *(PostAggRegTuple **)(this_00 + 8);
            if (__position._M_current == *(PostAggRegTuple **)(this_00 + 0x10)) {
              std::vector<PostAggRegTuple,std::allocator<PostAggRegTuple>>::
              _M_realloc_insert<PostAggRegTuple_const&>
                        (this_00,__position,(PostAggRegTuple *)local_5c8);
            }
            else {
              ((__position._M_current)->post).first = local_5c8._16_8_;
              ((__position._M_current)->post).second = local_5c8._24_8_;
              ((__position._M_current)->local).first = local_5c8._0_8_;
              ((__position._M_current)->local).second = local_5c8._8_8_;
              *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x20;
            }
          }
          else {
            uVar16 = *(undefined8 *)
                      ((long)iVar37.
                             super__Node_iterator_base<std::pair<const_PostAggRegTuple,_unsigned_long>,_true>
                             ._M_cur + 0x28);
            ppVar13 = (localAggReg->
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            *(size_t *)((long)&ppVar13->first + lVar47) = depth;
            *(undefined8 *)((long)&ppVar13->second + lVar47) = uVar16;
          }
        }
        else if (depth + 1 != uVar43) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"ERROR ERROR ERROR - postAggregate is empty ",0x2b);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"we would expect it to contain something || ",0x2b);
          poVar39 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar39," : ",3);
          poVar39 = std::ostream::_M_insert<unsigned_long>((ulong)poVar39);
          std::__ostream_insert<char,std::char_traits<char>>(poVar39,"  ",2);
          poVar39 = std::ostream::_M_insert<unsigned_long>((ulong)poVar39);
          std::operator<<(poVar39,"\n");
LAB_002423d5:
          exit(1);
        }
        lVar35 = lVar35 + 1;
        lVar47 = lVar47 + 0x10;
      } while (__n + (__n == 0) != lVar35);
    }
  }
  else if (this->viewLevelRegister[view_id] ==
           (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3 && pbVar9 != pbVar8) goto LAB_002424b0;
  if (this->viewLevelRegister[view_id] == depth) {
    if (pbVar9 == pbVar8) goto LAB_002429b3;
  }
  else if ((depth != 0) ||
          (this->viewLevelRegister[view_id] !=
           (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3 || pbVar9 == pbVar8)) goto LAB_002429b3;
  lVar35 = 8;
  local_670 = local_670 << 3;
  lVar47 = 0;
  do {
    pDVar19 = (this->dependentComputation).
              super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pDVar12 = pDVar19 + lVar47;
    memset(local_370,0,0xf9);
    memcpy(local_370,pDVar12,0xc0);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(&local_2b0,&pDVar19[lVar47].view);
    local_298 = (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 3;
    uStack_290 = 0;
    local_5c8._56_8_ = 0;
    local_5c8[0x40] = false;
    local_5c8._72_8_ = 0;
    memset(local_490,0,0xf9);
    local_5c8._16_8_ = 0;
    local_5c8._24_8_ = 0;
    local_5c8._32_8_ = 0;
    local_5c8._40_8_ = 0;
    local_5c8[0x30] = false;
    memset(local_5c8 + 0x58,0,0xd9);
    local_5c8._8_8_ = local_650;
    local_5c8._0_8_ = view_id;
    local_5c8._16_8_ =
         (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3;
    if (this->viewLevelRegister[view_id] == local_5c8._16_8_) {
      local_5c8._24_8_ = 0;
    }
    else {
      local_5c8._16_16_ =
           *(undefined1 (*) [16])
            (local_630.
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar47);
    }
    local_5c8._32_16_ =
         *(undefined1 (*) [16])
          ((localAggReg->
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start + lVar47);
    pDVar20 = (this->dependentComputation).
              super__Vector_base<DependentComputation,_std::allocator<DependentComputation>_>.
              _M_impl.super__Vector_impl_data._M_start;
    memcpy(local_5c8 + 0x58,pDVar20 + lVar47,0xc0);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(&local_4b0,&pDVar20[lVar47].view);
    memcpy(local_490,local_370,0xc0);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::operator=(&local_3d0,&local_2b0);
    local_3b8 = local_298;
    uStack_3b0 = uStack_290;
    local_3a8 = local_288;
    uStack_3a0 = uStack_280;
    local_398 = (bool)local_278;
    if ((pDVar12->product).super__Base_bitset<24UL>._M_w[0] == 0) {
      uVar43 = 0xffffffffffffffff;
      do {
        if (uVar43 == 0x16) {
          uVar45 = 0x17;
          break;
        }
        uVar45 = uVar43 + 1;
        lVar46 = uVar43 * 8;
        uVar43 = uVar45;
      } while (*(long *)((long)(pDVar19->product).super__Base_bitset<24UL>._M_w +
                        lVar46 + lVar35 + 8) == 0);
      if ((uVar45 < 0x17) ||
         ((pDVar12->view).
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          *(pointer *)
           ((long)&(pDVar12->view).
                   super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ._M_impl + 8))) goto LAB_0024293f;
    }
    else {
LAB_0024293f:
      local_498 = true;
    }
    std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>::push_back
              ((vector<AggregateTuple,_std::allocator<AggregateTuple>_> *)
               ((long)&(((this->aggregateComputation).
                         super__Vector_base<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>,_std::allocator<std::vector<AggregateTuple,_std::allocator<AggregateTuple>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<AggregateTuple,_std::allocator<AggregateTuple>_>)._M_impl.
                       super__Vector_impl_data + local_670),(value_type *)local_5c8);
    if (local_3d0.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3d0.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_4b0.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b0.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2b0.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.
                      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar47 = lVar47 + 1;
    lVar35 = lVar35 + 0xd8;
  } while (lVar47 != __n + (__n == 0));
LAB_002429b3:
  if (local_6a8.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_6a8.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_630.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_630.
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_390.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_390.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CppGenerator::registerAggregatesToVariables(
    Aggregate* aggregate, const size_t group_id,
    const size_t view_id, const size_t agg_id, const size_t depth,
    std::vector<std::pair<size_t, size_t>>& localAggReg)
{
    std::vector<std::pair<size_t,size_t>>& incoming = aggregate->_incoming;

    View* view = _qc->getView(view_id);
    TDNode* node = _td->getRelation(view->_origin);
    const var_bitset& relationBag = node->_bag;
    
    const std::vector<size_t>& varOrder = groupVariableOrder[group_id];
    const var_bitset& varOrderBitset = groupVariableOrderBitset[group_id];
    
    const size_t numLocalProducts = aggregate->_agg.size();
    const size_t numberIncomingViews =
        (view->_origin == view->_destination ? node->_numOfNeighbors :
         node->_numOfNeighbors - 1);
    
    dyn_bitset loopFactors(_qc->numberOfViews()+1);

    std::vector<std::pair<size_t, size_t>>
        localComputation(numLocalProducts, {varOrder.size(), 0});

    std::vector<std::pair<size_t,size_t>> viewReg;
    prod_bitset localFunctions, considered;

    // TODO: we computed this before - perhaps reuse?! 
    // Compute dependent variables on the variables in the head of view:
    var_bitset dependentVariables;
    var_bitset nonVarOrder = view->_fVars & ~varOrderBitset;

    for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
    {
        if (nonVarOrder[var])
        {
            // find bag that contains this variable
            if (relationBag[var])
                dependentVariables |= relationBag & ~varOrderBitset;
            else
            {
                // check incoming views
                for (const size_t& incViewID : incomingViews[view_id])
                {
                    View* incView = _qc->getView(incViewID);
                    if (incView->_fVars[var])
                        dependentVariables |= incView->_fVars & ~varOrderBitset;
                }
            }
        }
    }
    
    // go over each product and check if parts of it can be computed at current depth
    size_t incCounter = 0;
    for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
    {
        prod_bitset &product = aggregate->_agg[prodID];

        considered.reset();
        localFunctions.reset();
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (product.test(f) && !considered[f])
            {
                Function* function = _qc->getFunction(f);
                considered.set(f);
                
                // check if this function is covered
                if ((function->_fVars & coveredVariables[depth]) == function->_fVars)
                {   
                    // get all variables that this function depends on. 
                    var_bitset dependentFunctionVars;
                    for (size_t var=0; var<NUM_OF_VARIABLES;++var)
                    {
                        if (function->_fVars[var])
                            dependentFunctionVars |= variableDependency[var];
                    }
                    dependentFunctionVars &= ~varOrderBitset;

                    // Find all functions that overlap / depend on this function
                    bool overlaps, computeHere;
                    var_bitset overlapVars;
                    prod_bitset overlapFunc = prod_bitset().set(f);

                    do
                    {
                        overlaps = false;
                        computeHere = true;
                        overlapVars |= function->_fVars;

                        for (size_t f2 = 0; f2 < NUM_OF_FUNCTIONS; ++f2)
                        {
                            if (product[f2] && !considered[f2] && !overlapFunc[f2])
                            {
                                Function* otherFunction = _qc->getFunction(f);
                                const var_bitset& otherFVars = otherFunction->_fVars;
                                // check if functions depend on each other
                                // if ((otherFunction->_fVars & nonVarOrder).any()) 
                                if ((otherFVars & dependentFunctionVars).any())
                                {
                                    considered.set(f2);
                                    overlapFunc.set(f2);
                                    overlaps = true;
                                    overlapVars |= otherFunction->_fVars;
                                    // check if otherFunction is covered
                                    if ((otherFVars & coveredVariables[depth]) !=
                                        otherFVars)
                                    {
                                        // if it is not covered then compute entire
                                        // group at later stage
                                        computeHere = false;
                                    }
                                }
                            }
                        }
                    } while(overlaps && !computeHere);
                                    
                    if (computeHere)
                    {
                        // check if the variables are dependent on vars in head
                        // of outcoming view
                        if (((overlapVars & ~varOrderBitset) & dependentVariables).any())
                        {
                            if (viewLevelRegister[view_id] != depth)
                                ERROR("ERROR ERROR: in dependent computation:"
                                      <<" viewLevelRegister[viewID] != depth\n");
                            
                            dependentComputation[prodID].product |= overlapFunc;
                        }
                        else // add all functions that overlap together at this level!
                            localFunctions |= overlapFunc;

                        // remove overlapping functions from product
                        product &= ~overlapFunc;
                    }
                }
            }
        }
        
        // go over each incoming views and check if their incoming products can
        // be computed at this level. 
        viewReg.clear();

        for (size_t n = 0; n < numberIncomingViews; ++n)
        {
            size_t& incViewID = incoming[incCounter].first;

            if (addableViews[incViewID + (depth * (_qc->numberOfViews()+1))])
            {
                View* incView = _qc->getView(incViewID);

                // TODO: I think the below statement is fine but should we use
                // dependent variables instead?! - here we just check if any of
                // the vars from incView are present in the vars for view
                if (((incView->_fVars & ~varOrderBitset) & view->_fVars).none())
                {
                    viewReg.push_back(incoming[incCounter]);

                    /************** PRINT OUT ****************/
                    // if (group_id == 5 &&  incoming[incCounter].first == 2 &&
                    //     incoming[incCounter].second == 125)
                    // {
                    //     std::cout << "##--------" <<
                    //         incoming[incCounter].first << " - " <<
                    //         incoming[incCounter].second << std::endl;
                    // }
                    /************** PRINT OUT ****************/
                }
                else
                {
                    // if (depth == viewLevelRegister[view_id])
                    // {
                    // std::cout << "This view has an additional variable: "+
                    //     viewName[incViewID]+"\nviewAgg: aggs_"+viewName[incViewID]
                    //     +"-"+" viewLevelReg: "<<viewLevelRegister[view_id]<<
                    //     " depth: " << depth << std::endl;
                    dependentComputation[prodID].view.push_back(
                        incoming[incCounter]);
                    // }
                    // if (depth != viewLevelRegister[view_id])
                    // {
                    //     ERROR(depth << "  " << incViewID << "  " << view_id << " "
                    //           << viewLevelRegister[view_id] << " "+node->_name+" ");
                    //     ERROR(view->_fVars << std::endl);
                    //     ERROR("IS THIS A MISTAKE?!\n");
                    // }       
                }

                // This incoming view will no longer be considered 
                incoming[incCounter].first = _qc->numberOfViews();
            }
            ++incCounter;
        }
        
        // Check if this product has already been computed, if not we add it
        // to the list
        if (localFunctions.any() || !viewReg.empty() ||
            (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none()))
        {                
            ProductAggregate prodAgg;
            prodAgg.product = localFunctions;
            prodAgg.viewAggregate = viewReg;
            
            if (depth <= viewLevelRegister[view_id] &&
                viewLevelRegister[view_id] != varOrder.size())
            {
                prodAgg.previous = localAggReg[prodID];
            }
            else
                prodAgg.previous = {varOrder.size(), 0};

            if (depth+1 == varOrder.size() &&
                (dependentVariables & relationBag & nonVarOrder).none())
                prodAgg.multiplyByCount = true;
            else
                prodAgg.multiplyByCount = false;
            
            auto prod_it = productToVariableMap[depth].find(prodAgg);
            if (prod_it != productToVariableMap[depth].end())
            {
                // Then update the localAggReg for this product
                localComputation[prodID] = {depth,prod_it->second};                
            }
            else
            {
                size_t newProdID =  productToVariableRegister[depth].size();
                // If so, add it to the aggregate register
                productToVariableMap[depth][prodAgg] = newProdID;
                localComputation[prodID] = {depth,newProdID};
                productToVariableRegister[depth].push_back(prodAgg);                
            }
            
            localAggReg[prodID] = localComputation[prodID];

            /******** PRINT OUT **********/
            // dyn_bitset contribViews(_qc->numberOfViews()+1);
            // for (auto& p : viewReg)
            //     contribViews.set(p.first);
            
            // std::cout << "group_id " << group_id << " depth: " << depth << std::endl;
            // std::cout << genProductString(*node, contribViews, localFunctions)
            //           << std::endl;
            /******** PRINT OUT **********/
        }    
        // if we didn't set a new computation - check if this level is the view Level:
        else if (depth == viewLevelRegister[view_id])
        {
            // Add the previous aggregate to local computation
            localComputation[prodID] = localAggReg[prodID];
            // TODO: (CONSIDER) think about keeping this separate as above
        }
        else if (depth+1 == varOrder.size())
        {
            ERROR("WE HAVE A PRODUCT THAT DOES NOT OCCUR AT THE LOWEST LEVEL!?");
            exit(1);
        }
    }
    
    // recurse to next depth ! 
    if (depth != varOrder.size()-1)
    {
        registerAggregatesToVariables(
            aggregate,group_id,view_id,agg_id,depth+1,localAggReg);
    }
    else
    {
        // resetting aggRegisters !        
        for (size_t i = 0; i < numLocalProducts; ++i)
            localAggReg[i] = {varOrder.size(),0};
    }
    
    if (depth > viewLevelRegister[view_id] ||
        viewLevelRegister[view_id] == varOrder.size())
    {
        // now adding aggregates coming from below to running sum
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            if (localComputation[prodID].first < varOrder.size() ||
                localAggReg[prodID].first < varOrder.size())
            {
                PostAggRegTuple postTuple;                
                postTuple.local = localComputation[prodID];
                postTuple.post = localAggReg[prodID];

                auto postit = postRegisterMap[depth].find(postTuple);
                if (postit != postRegisterMap[depth].end())
                {
                    localAggReg[prodID] = {depth,postit->second};
                }
                else
                {
                    size_t postProdID = postRegisterList[depth].size();
                    postRegisterMap[depth][postTuple] = postProdID;
                    localAggReg[prodID] = {depth, postProdID};
                    postRegisterList[depth].push_back(postTuple);
                }
            }
            else if (depth+1 != varOrder.size())
            {
                ERROR("ERROR ERROR ERROR - postAggregate is empty ");
                ERROR("we would expect it to contain something || ");
                ERROR(depth << " : " << varOrder.size()<< "  " << prodID << "\n");
                exit(1);
            }
        }
    }
    
    if (depth == viewLevelRegister[view_id] || 
        (depth == 0 && viewLevelRegister[view_id] == varOrder.size()))
    {
        // We now add both components to the respecitve registers
        // std::pair<bool,size_t> regTupleProduct;
        // std::pair<bool,size_t> regTupleView;

        // now adding aggregates to final computation 
        for (size_t prodID = 0; prodID < numLocalProducts; ++prodID)
        {
            // TODO: Why not avoid this loop and put the vectors into the
            // AggregateTuple
            // This is then one aggregateTuple for one specific Aggregate for
            // this view
            // THen add this aggregate to the specific view and not to depth
            
            const prod_bitset&  dependentFunctions =
                dependentComputation[prodID].product;
            const std::vector<std::pair<size_t,size_t>>& dependentViewReg =
                dependentComputation[prodID].view;

            ProductAggregate prodAgg;
            prodAgg.product = dependentFunctions;
            prodAgg.viewAggregate = dependentViewReg;
            prodAgg.previous = {varOrder.size(), 0};
            
            AggregateTuple aggComputation;
            aggComputation.viewID = view_id;
            aggComputation.aggID = agg_id;
            if (viewLevelRegister[view_id] != varOrder.size()) 
                aggComputation.local = localComputation[prodID];
            else
                 aggComputation.local = {varOrder.size(), 0};
            aggComputation.post = localAggReg[prodID];
            aggComputation.dependentComputation = dependentComputation[prodID];
            aggComputation.dependentProdAgg = prodAgg;

            if (dependentFunctions.any() || !dependentViewReg.empty())
                aggComputation.hasDependentComputation = true;
            
            // if (dependentFunctions.any() || !dependentViewReg.empty())
            // {                
            //     ProductAggregate prodAgg;
            //     prodAgg.product = dependentFunctions;
            //     prodAgg.viewAggregate = dependentViewReg;
            //     prodAgg.previous = {varOrder.size(), 0};
            //     auto prod_it = productToVariableMap[depDepth].find(prodAgg);
            //     if (prod_it != productToVariableMap[depDepth].end())
            //     {
            //         // Then update the localAggReg for this product
            //         aggComputation.dependentProduct = {depDepth,prod_it->second};
            //     }
            //     else
            //     {
            //         // If so, add it to the aggregate register
            //         size_t newProdID = productToVariableRegister[depDepth].size();
            //         productToVariableMap[depDepth][prodAgg] = newProdID;
            //         aggComputation.dependentProduct = {depDepth,newProdID};
            //         productToVariableRegister[depDepth].push_back(prodAgg);
            //     }
            // }
            // else
            // {
            //     aggComputation.dependentProduct = {varOrder.size(), 0};
            // }
            
            aggregateComputation[view_id].push_back(aggComputation);
        }
    }
}